

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O2

void __thiscall Am_Point_List_Data::Print(Am_Point_List_Data *this,ostream *os)

{
  ostream *poVar1;
  Am_Point_List_Data *pAVar2;
  
  poVar1 = std::operator<<(os,"LIST(");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,*(ushort *)&(this->super_Am_Wrapper).field_0xc);
  std::operator<<(poVar1,") [");
  pAVar2 = this;
  while (pAVar2 = (Am_Point_List_Data *)pAVar2->head, pAVar2 != (Am_Point_List_Data *)this->tail) {
    poVar1 = std::operator<<(os,'(');
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,*(float *)&(pAVar2->super_Am_Wrapper).super_Am_Registered_Type.
                                          _vptr_Am_Registered_Type);
    poVar1 = std::operator<<(poVar1,',');
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,*(float *)((long)&(pAVar2->super_Am_Wrapper).super_Am_Registered_Type
                                                 ._vptr_Am_Registered_Type + 4));
    std::operator<<(poVar1,") ");
  }
  if (pAVar2 != (Am_Point_List_Data *)0x0) {
    poVar1 = std::operator<<(os,'(');
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,*(float *)&(pAVar2->super_Am_Wrapper).super_Am_Registered_Type.
                                          _vptr_Am_Registered_Type);
    poVar1 = std::operator<<(poVar1,',');
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,*(float *)((long)&(pAVar2->super_Am_Wrapper).super_Am_Registered_Type
                                                 ._vptr_Am_Registered_Type + 4));
    std::operator<<(poVar1,')');
  }
  std::operator<<(os,"]");
  return;
}

Assistant:

void
Am_Point_List_Data::Print(std::ostream &os) const
{
  Am_Point_Item *current;
  os << "LIST(" << number << ") [";
  for (current = head; current != tail; current = current->next) {
    os << '(' << current->x << ',' << current->y << ") ";
  }
  if (current) {
    os << '(' << current->x << ',' << current->y << ')';
  }
  os << "]";
}